

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O3

void test_bhdct_get_lots_string_key(planck_unit_test_t *tc)

{
  uint uVar1;
  int iVar2;
  char key [9];
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  int local_b0;
  int local_ac;
  char local_a8 [16];
  ion_dictionary_t local_98;
  ion_dictionary_handler_t local_80;
  
  local_a8[8] = 0;
  local_a8[0] = '\0';
  local_a8[1] = '\0';
  local_a8[2] = '\0';
  local_a8[3] = '\0';
  local_a8[4] = '\0';
  local_a8[5] = '\0';
  local_a8[6] = '\0';
  local_a8[7] = '\0';
  bhdct_setup_string_key(tc,&local_80,&local_98,ion_fill_none);
  uVar1 = 0x11d;
  iVar2 = 0x5dc;
  do {
    uVar1 = uVar1 + 0xf;
    sprintf(local_a8,"k%d",(ulong)uVar1);
    local_ac = iVar2;
    bhdct_insert(tc,&local_98,local_a8,&local_ac,'\x01');
    iVar2 = iVar2 + 0x4b;
  } while (uVar1 < 0x3d9);
  uVar1 = 0x11d;
  iVar2 = 0x5dc;
  do {
    uVar1 = uVar1 + 0xf;
    sprintf(local_a8,"k%d",(ulong)uVar1);
    local_b0 = iVar2;
    bhdct_get(tc,&local_98,local_a8,&local_b0,'\0',1);
    iVar2 = iVar2 + 0x4b;
  } while (uVar1 < 0x3d9);
  bhdct_delete_dictionary(tc,&local_98);
  bhdct_close_master_table(tc);
  bhdct_delete_master_table(tc);
  return;
}

Assistant:

void
test_bhdct_get_lots_string_key(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;
	char						key[ION_BHDCT_STRING_KEY_BUFFER_SIZE] = { 0 };

	bhdct_setup_string_key(tc, &handler, &dict, ion_fill_none);

	int i;

	for (i = 300; i < 1000; i += 15) {
		sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, i);
		bhdct_insert(tc, &dict, key, IONIZE(i * 5, int), boolean_true);
	}

	for (i = 300; i < 1000; i += 15) {
		sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, i);
		bhdct_get(tc, &dict, key, IONIZE(i * 5, int), err_ok, 1);
	}

	bhdct_takedown(tc, &dict);
}